

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

void __thiscall wasm::I64ToI32Lowering::visitGlobalSet(I64ToI32Lowering *this,GlobalSet *curr)

{
  Builder *this_00;
  bool bVar1;
  Index index;
  size_type sVar2;
  LocalGet *value;
  GlobalSet *right;
  Block *expression;
  char *extraout_RDX;
  Name NVar3;
  optional<wasm::Type> type;
  undefined1 local_58 [8];
  TempVar highBits;
  
  sVar2 = std::
          _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::count(&(this->originallyI64Globals)._M_h,&curr->name);
  if (sVar2 != 0) {
    bVar1 = handleUnreachable(this,(Expression *)curr);
    if (!bVar1) {
      fetchOutParam((TempVar *)local_58,this,curr->value);
      highBits.ty.id =
           (uintptr_t)
           (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      NVar3.super_IString.str._M_str = extraout_RDX;
      NVar3.super_IString.str._M_len = (size_t)(curr->name).super_IString.str._M_str;
      NVar3 = makeHighName((wasm *)(curr->name).super_IString.str._M_len,NVar3);
      this_00 = (this->builder)._M_t.
                super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
      index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
      value = Builder::makeLocalGet(this_00,index,(Type)0x2);
      right = Builder::makeGlobalSet((Builder *)highBits.ty.id,NVar3,(Expression *)value);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._8_8_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)value;
      expression = Builder::makeSequence
                             ((this->builder)._M_t.
                              super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                              .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                              (Expression *)curr,(Expression *)right,type);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)expression);
      TempVar::~TempVar((TempVar *)local_58);
    }
  }
  return;
}

Assistant:

void visitGlobalSet(GlobalSet* curr) {
    if (!originallyI64Globals.count(curr->name)) {
      return;
    }
    if (handleUnreachable(curr)) {
      return;
    }
    TempVar highBits = fetchOutParam(curr->value);
    auto* setHigh = builder->makeGlobalSet(
      makeHighName(curr->name), builder->makeLocalGet(highBits, Type::i32));
    replaceCurrent(builder->makeSequence(curr, setHigh));
  }